

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O0

void CIF::calculateTiling
               (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *basis,double x_width,double y_width,double z_width,Vector3i *mins,Vector3i *maxs)

{
  int iVar1;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pCVar2;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *pCVar3;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar4;
  Scalar *pSVar5;
  Index IVar6;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar7;
  long lVar8;
  Scalar *pSVar9;
  long lVar10;
  long lVar11;
  Scalar *pSVar12;
  DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *pDVar13;
  double __x;
  double dVar14;
  double __x_00;
  double __x_01;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  PVar15;
  Scalar local_418;
  long rnd_z;
  long rnd_y;
  long rnd_x;
  int i_1;
  Scalar local_3f4;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_3f0;
  Scalar local_3cc;
  Scalar local_3c8;
  Scalar local_3c4;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> local_3c0;
  long local_3a0;
  long min;
  long max;
  Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>
  local_358;
  RowXpr local_340;
  Matrix<double,4,1,0,4,1> local_308 [8];
  Vector4d temp_row;
  int local_2dc;
  int local_2d8;
  int i;
  undefined1 local_2d0 [8];
  MatrixXd affine_cube;
  Scalar local_2b0;
  Scalar local_2a8;
  Scalar local_2a0;
  Scalar local_298;
  Scalar local_290;
  Scalar local_288;
  Scalar local_280;
  Scalar local_278;
  Scalar local_270;
  Scalar local_268;
  Scalar local_260;
  Scalar local_258;
  Scalar local_250;
  Scalar local_248;
  Scalar local_240;
  Scalar local_238;
  Scalar local_230;
  Scalar local_228;
  Scalar local_220;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_218;
  int local_1f8 [2];
  undefined1 local_1f0 [8];
  MatrixXd cuboid;
  LhsNested local_1d0;
  Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  affine_transform_matrix;
  Scalar local_1b8;
  Scalar local_1b0;
  Scalar local_1a8;
  Scalar local_1a0;
  Scalar local_198;
  Scalar local_190;
  CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> local_188;
  undefined1 local_168 [8];
  Matrix4d real_basis;
  Scalar local_e0;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8;
  Scalar local_a0;
  Scalar local_98 [3];
  Scalar local_80;
  CommaInitializer<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  int local_58 [2];
  undefined1 local_50 [8];
  MatrixXd affine_basis;
  Vector3i *maxs_local;
  Vector3i *mins_local;
  double z_width_local;
  double y_width_local;
  double x_width_local;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *basis_local;
  
  local_58[1] = 3;
  local_58[0] = 4;
  affine_basis.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)maxs;
  mins_local = (Vector3i *)z_width;
  z_width_local = y_width;
  y_width_local = x_width;
  x_width_local = (double)basis;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_50,local_58 + 1,local_58);
  local_80 = 0.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_78,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_50,&local_80);
  local_98[0] = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_78,local_98);
  local_a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a0);
  local_a8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_a8);
  local_b0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b0);
  local_b8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_b8);
  local_c0 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_c0);
  local_c8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_c8);
  local_d0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_d0);
  local_d8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_d8);
  local_e0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_e0);
  real_basis.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
  [0xf] = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar2,real_basis.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                    m_storage.m_data.array + 0xf);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_78);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_168);
  local_190 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator<<
            (&local_188,(DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_168,&local_190);
  local_198 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (&local_188,&local_198);
  local_1a0 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_1a0);
  local_1a8 = 1.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_1a8);
  local_1b0 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_1b0);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,1);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,2);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,0);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  local_1b8 = 0.0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,&local_1b8);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,1);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,1);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,1);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,2);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,1);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  affine_transform_matrix.m_rhs.m_xpr = (XprTypeNested)0x0;
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_
                     (pCVar3,(Scalar *)&affine_transform_matrix.m_rhs);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,0);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,1);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,2);
  pCVar3 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  pDVar4 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
           std::
           vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         *)x_width_local,2);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()(pDVar4,2);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::operator_(pCVar3,pSVar5);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::~CommaInitializer(&local_188);
  cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (Index)Eigen::MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::inverse
                        ((MatrixBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)local_168);
  PVar15 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::operator*
                     ((MatrixBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_50,
                      (MatrixBase<Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                      &cuboid.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                       m_storage.m_cols);
  affine_transform_matrix.m_lhs = (LhsNested)PVar15.m_rhs.m_xpr;
  local_1d0 = PVar15.m_lhs;
  local_1f8[1] = 8;
  local_1f8[0] = 4;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_1f0,local_1f8 + 1,local_1f8);
  local_220 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator<<
            (&local_218,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0,&local_220
            );
  local_228 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (&local_218,&local_228);
  local_230 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_230);
  local_238 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_238);
  local_240 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_240);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&y_width_local);
  local_248 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_248);
  local_250 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_250);
  local_258 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_258);
  local_260 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_260);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&z_width_local);
  local_268 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_268);
  local_270 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_270);
  local_278 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_278);
  local_280 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_280);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&mins_local);
  local_288 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_288);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&y_width_local);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&z_width_local);
  local_290 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_290);
  local_298 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_298);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&y_width_local);
  local_2a0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2a0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&mins_local);
  local_2a8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2a8);
  local_2b0 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&local_2b0);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&z_width_local);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)&mins_local);
  affine_cube.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3ff0000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,(Scalar *)
                             &affine_cube.
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&y_width_local);
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
                     (pCVar2,&z_width_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator_
            (pCVar2,(Scalar *)&mins_local);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::~CommaInitializer(&local_218);
  i = 8;
  local_2d8 = 3;
  Eigen::Matrix<double,-1,-1,0,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,0,_1,_1> *)local_2d0,&i,&local_2d8);
  local_2dc = 0;
  while( true ) {
    IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0);
    if (IVar6 <= local_2dc) break;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              (&local_340,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_1f0,
               (long)local_2dc);
    Eigen::Matrix<double,4,1,0,4,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false>>
              (local_308,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_> *)
               &local_340);
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
    ::operator*(&local_358,
                (MatrixBase<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Inverse<Eigen::Matrix<double,4,4,0,4,4>>,0>>
                 *)&local_1d0,(MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)local_308);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::row
              ((RowXpr *)&max,(DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2d0,
               (long)local_2dc);
    Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,1,-1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,1,_1,false> *)&max,
               (DenseBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Inverse<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)&local_358);
    local_2dc = local_2dc + 1;
  }
  min = std::numeric_limits<long>::min();
  local_3a0 = std::numeric_limits<long>::max();
  local_3c4 = (Scalar)min;
  Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
            (&local_3c0,
             (DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)
             affine_basis.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
             .m_cols,&local_3c4);
  local_3c8 = (Scalar)min;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                     (&local_3c0,&local_3c8);
  local_3cc = (Scalar)min;
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar7,&local_3cc);
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_3c0);
  local_3f4 = (Scalar)local_3a0;
  Eigen::DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator<<
            (&local_3f0,(DenseBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)mins,&local_3f4);
  i_1 = (Scalar)local_3a0;
  pCVar7 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(&local_3f0,&i_1);
  rnd_x._4_4_ = (Scalar)local_3a0;
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
            (pCVar7,(Scalar *)((long)&rnd_x + 4));
  Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_3f0);
  rnd_x._0_4_ = 0;
  while( true ) {
    lVar8 = (long)(int)rnd_x;
    IVar6 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_2d0);
    if (IVar6 <= lVar8) break;
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0,
                        (long)(int)rnd_x,0);
    iVar1 = sgn<double>(*pSVar9);
    pDVar13 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
              (pDVar13,(long)(int)rnd_x,0);
    std::abs((int)pDVar13);
    dVar14 = ceil(__x);
    lVar8 = (long)((double)iVar1 * dVar14);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0,
                        (long)(int)rnd_x,1);
    iVar1 = sgn<double>(*pSVar9);
    pDVar13 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
              (pDVar13,(long)(int)rnd_x,1);
    std::abs((int)pDVar13);
    dVar14 = ceil(__x_00);
    lVar10 = (long)((double)iVar1 * dVar14);
    pSVar9 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0,
                        (long)(int)rnd_x,2);
    iVar1 = sgn<double>(*pSVar9);
    pDVar13 = (DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)local_2d0;
    Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
              (pDVar13,(long)(int)rnd_x,2);
    std::abs((int)pDVar13);
    dVar14 = ceil(__x_01);
    lVar11 = (long)((double)iVar1 * dVar14);
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                         affine_basis.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,0);
    rnd_y._0_4_ = (Scalar)lVar8;
    if (*pSVar12 < lVar8) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                           affine_basis.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,0);
      *pSVar12 = (Scalar)rnd_y;
    }
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,0);
    if (lVar8 < *pSVar12) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,0);
      *pSVar12 = (Scalar)rnd_y;
    }
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                         affine_basis.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,1);
    rnd_z._0_4_ = (Scalar)lVar10;
    if (*pSVar12 < lVar10) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                           affine_basis.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,1);
      *pSVar12 = (Scalar)rnd_z;
    }
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,1);
    if (lVar10 < *pSVar12) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,1);
      *pSVar12 = (Scalar)rnd_z;
    }
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                         affine_basis.
                         super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                         m_cols,2);
    local_418 = (Scalar)lVar11;
    if (*pSVar12 < lVar11) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                           affine_basis.
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols,2);
      *pSVar12 = local_418;
    }
    pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,2);
    if (lVar11 < *pSVar12) {
      pSVar12 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)mins,2);
      *pSVar12 = local_418;
    }
    rnd_x._0_4_ = (int)rnd_x + 1;
  }
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_2d0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_1f0);
  Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_0,__1,__1> *)local_50);
  return;
}

Assistant:

void calculateTiling(std::vector<Eigen::Vector3d> &basis, double x_width, double y_width, double z_width,
                         Eigen::Vector3i &mins, Eigen::Vector3i &maxs) {
        Eigen::MatrixXd affine_basis(3, 4);
        affine_basis << 0.0, 1.0, 0.0, 0.0,
                0.0, 0.0, 1.0, 0.0,
                0.0, 0.0, 0.0, 1.0;

        Eigen::Matrix4d real_basis;
        real_basis << 1.0, 1.0, 1.0, 1.0,
                0.0, basis[0](0), basis[1](0), basis[2](0),
                0.0, basis[0](1), basis[1](1), basis[2](1),
                0.0, basis[0](2), basis[1](2), basis[2](2);

        auto affine_transform_matrix = affine_basis * real_basis.inverse();

        Eigen::MatrixXd cuboid(8, 4);
        cuboid << 1.0, 0.0, 0.0, 0.0,
                1.0, x_width, 0.0, 0.0,
                1.0, 0.0, y_width, 0.0,
                1.0, 0.0, 0.0, z_width,
                1.0, x_width, y_width, 0,
                1.0, x_width, 0.0, z_width,
                1.0, 0.0, y_width, z_width,
                1.0, x_width, y_width, z_width;

        // affine transform the cuboid
        Eigen::MatrixXd affine_cube(8, 3);
        for (int i = 0; i < cuboid.rows(); ++i) {
            Eigen::Vector4d temp_row = cuboid.row(i);
            affine_cube.row(i) = affine_transform_matrix * temp_row;
        }

        // get the limits of the cube in affine space
        long max = std::numeric_limits<long>::min();
        long min = std::numeric_limits<long>::max();

        maxs << max, max, max;
        mins << min, min, min;

        for (int i = 0; i < affine_cube.rows(); ++i) {
            long rnd_x = (long) sgn(affine_cube(i, 0)) * std::ceil(std::abs(affine_cube(i, 0)));
            long rnd_y = (long) sgn(affine_cube(i, 1)) * std::ceil(std::abs(affine_cube(i, 1)));
            long rnd_z = (long) sgn(affine_cube(i, 2)) * std::ceil(std::abs(affine_cube(i, 2)));

            if (rnd_x > maxs(0))
                maxs(0) = rnd_x;
            if (rnd_x < mins(0))
                mins(0) = rnd_x;
            if (rnd_y > maxs(1))
                maxs(1) = rnd_y;
            if (rnd_y < mins(1))
                mins(1) = rnd_y;
            if (rnd_z > maxs(2))
                maxs(2) = rnd_z;
            if (rnd_z < mins(2))
                mins(2) = rnd_z;
        }
    }